

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

void __thiscall
icu_63::NFRuleSet::setBestFractionRule
          (NFRuleSet *this,int32_t originalIndex,NFRule *newRule,UBool rememberRule)

{
  UChar UVar1;
  DecimalFormatSymbols *pDVar2;
  UChar UVar3;
  UnicodeString UStack_68;
  
  if (rememberRule != '\0') {
    NFRuleList::add(&this->fractionRules,newRule);
  }
  if (this->nonNumericalRules[originalIndex] != (NFRule *)0x0) {
    pDVar2 = RuleBasedNumberFormat::getDecimalFormatSymbols(this->owner);
    UnicodeString::UnicodeString(&UStack_68,(UnicodeString *)&pDVar2->field_0x8);
    if (-1 < UStack_68.fUnion.fStackFields.fLengthAndFlags) {
      UStack_68.fUnion.fFields.fLength = (int)UStack_68.fUnion.fStackFields.fLengthAndFlags >> 5;
    }
    if (UStack_68.fUnion.fFields.fLength == 0) {
      UVar3 = L'\xffff';
    }
    else {
      if (((int)UStack_68.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
        UStack_68.fUnion.fFields.fArray = UStack_68.fUnion.fStackFields.fBuffer;
      }
      UVar3 = *UStack_68.fUnion.fFields.fArray;
    }
    UVar1 = newRule->decimalPoint;
    UnicodeString::~UnicodeString(&UStack_68);
    if (UVar3 != UVar1) {
      return;
    }
  }
  this->nonNumericalRules[originalIndex] = newRule;
  return;
}

Assistant:

void NFRuleSet::setBestFractionRule(int32_t originalIndex, NFRule *newRule, UBool rememberRule) {
    if (rememberRule) {
        fractionRules.add(newRule);
    }
    NFRule *bestResult = nonNumericalRules[originalIndex];
    if (bestResult == NULL) {
        nonNumericalRules[originalIndex] = newRule;
    }
    else {
        // We have more than one. Which one is better?
        const DecimalFormatSymbols *decimalFormatSymbols = owner->getDecimalFormatSymbols();
        if (decimalFormatSymbols->getSymbol(DecimalFormatSymbols::kDecimalSeparatorSymbol).charAt(0)
            == newRule->getDecimalPoint())
        {
            nonNumericalRules[originalIndex] = newRule;
        }
        // else leave it alone
    }
}